

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O2

void ASDCP::Rat_to_extended(Rational rate,byte_t *buf)

{
  uint uVar1;
  ulong uVar2;
  byte_t bVar3;
  char cVar4;
  ulong uVar5;
  double dVar6;
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  dVar6 = ceil((double)rate.Numerator / (double)rate.Denominator);
  uVar2 = (ulong)dVar6;
  bVar3 = '\0';
  for (uVar5 = uVar2 & 0xffffffff; 3 < (uint)uVar5; uVar5 = (ulong)((uint)uVar5 >> 1)) {
    bVar3 = bVar3 + '\x01';
  }
  buf[1] = bVar3;
  cVar4 = -0x20;
  while ((uVar1 = (uint)uVar2, cVar4 != '\0' && (-1 < (int)uVar1))) {
    cVar4 = cVar4 + '\x01';
    uVar2 = (ulong)(uVar1 * 2);
  }
  *(uint *)(buf + 2) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return;
}

Assistant:

void
Rat_to_extended(ASDCP::Rational rate, byte_t* buf)
{
  memset(buf, 0, 10);
  ui32_t value = (ui32_t)ceil(rate.Quotient()); 
  ui32_t exp = value;
  exp >>= 1;
  ui8_t i = 0;

  for ( ; i < 32; i++ )
    {
      exp >>= 1;
      if ( ! exp )
	break;
    }

  *(buf+1) = i;

   for ( i = 32; i != 0 ; i-- )
     {
       if ( value & 0x80000000 )
	 break;
       value <<= 1;
     }

   Kumu::i2p<ui32_t>(KM_i32_BE(value), buf+2);
}